

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O1

void __thiscall Memory::HeapBlockMap64::ResetMarks(HeapBlockMap64 *this)

{
  L2MapChunk *__s;
  Node *pNVar1;
  uint i;
  long lVar2;
  
  for (pNVar1 = this->list; pNVar1 != (Node *)0x0; pNVar1 = pNVar1->next) {
    lVar2 = 0;
    do {
      __s = (pNVar1->map).map[lVar2];
      if (__s != (L2MapChunk *)0x0) {
        memset(__s,0,0x2000);
        __s->isNewChunk = false;
        memset(__s->pageMarkCount,0,0x200);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x1000);
  }
  return;
}

Assistant:

void
HeapBlockMap64::ResetMarks()
{
    Node * node = this->list;
    while (node != nullptr)
    {
        node->map.ResetMarks();
        node = node->next;
    }
}